

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristics.cpp
# Opt level: O1

void __thiscall
Clasp::ClaspVsids_t<Clasp::DomScore>::updateVar
          (ClaspVsids_t<Clasp::DomScore> *this,Solver *s,Var v,uint32 n)

{
  uint ns;
  DomScore local_38;
  
  if ((s->assign_).assign_.ebo_.size - 1 < v) {
    if (n != 0) {
      do {
        bk_lib::indexed_priority_queue<Clasp::ClaspVsids_t<Clasp::DomScore>::CmpScore>::remove
                  (&this->vars_,(char *)(ulong)v);
        v = v + 1;
        n = n - 1;
      } while (n != 0);
    }
  }
  else {
    ns = n + v;
    local_38.super_VsidsScore.value = 0.0;
    local_38.level = 0;
    local_38.factor = 1;
    local_38._12_4_ = 0x3fffffff;
    if ((this->score_).ebo_.size < ns) {
      if ((this->score_).ebo_.cap < ns) {
        bk_lib::pod_vector<Clasp::DomScore,_std::allocator<Clasp::DomScore>_>::reserve
                  (&this->score_,(ns >> 1) + ns);
      }
      bk_lib::pod_vector<Clasp::DomScore,_std::allocator<Clasp::DomScore>_>::resize
                (&this->score_,ns,&local_38);
    }
    local_38.super_VsidsScore.value = local_38.super_VsidsScore.value & 0xffffffff00000000;
    if ((this->occ_).ebo_.size < ns) {
      if ((this->occ_).ebo_.cap < ns) {
        bk_lib::pod_vector<int,_std::allocator<int>_>::reserve(&this->occ_,(ns >> 1) + ns);
      }
      bk_lib::pod_vector<int,_std::allocator<int>_>::resize(&this->occ_,ns,(int *)&local_38);
    }
    if (n != 0) {
      do {
        bk_lib::indexed_priority_queue<Clasp::ClaspVsids_t<Clasp::DomScore>::CmpScore>::update
                  (&this->vars_,(ulong)v);
        v = v + 1;
        n = n - 1;
      } while (n != 0);
    }
  }
  return;
}

Assistant:

void ClaspVsids_t<ScoreType>::updateVar(const Solver& s, Var v, uint32 n) {
	if (s.validVar(v)) {
		growVecTo(score_, v+n);
		growVecTo(occ_, v+n);
		for (uint32 end = v+n; v != end; ++v) { vars_.update(v); }
	}
	else {
		for (uint32 end = v+n; v != end; ++v) { vars_.remove(v); }
	}
}